

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O2

void __thiscall QtMWidgets::TableViewCellLayout::sizeHint(TableViewCellLayout *this)

{
  sizeHint((TableViewCellLayout *)&this[-1].detailedTextLabel);
  return;
}

Assistant:

QSize
TableViewCellLayout::sizeHint() const
{
	const QSize imageSize = imageLabel->sizeHint();

	int width = imageSize.width();
	int height = imageSize.height();

	const QSize textSize = textLabel->sizeHint();
	const QSize detailedTextSize = detailedTextLabel->sizeHint();

	width += qMax( textSize.width(), detailedTextSize.width() );
	height = qMax( height,
		textSize.height() + detailedTextSize.height() );

	const QSize accessorySize = accessoryWidget->sizeHint();

	width += accessorySize.width();
	height = qMax( height, accessorySize.height() );

	return QSize( width + contentsMargins().left() + contentsMargins().right(),
		height + contentsMargins().top() + contentsMargins().bottom() );
}